

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsObjectiveFunction.cpp
# Opt level: O3

void __thiscall
HighsObjectiveFunction::HighsObjectiveFunction
          (HighsObjectiveFunction *this,HighsMipSolver *mipsolver)

{
  int iVar1;
  iterator __position;
  int *piVar2;
  pointer pHVar3;
  pointer pdVar4;
  iterator __position_00;
  HighsLp *pHVar5;
  int iVar6;
  HighsInt HVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  double *__args;
  vector<int,_std::allocator<int>_> *__range1;
  int __tmp;
  int __tmp_1;
  int *piVar12;
  double dVar13;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  value_type_conflict2 local_34;
  
  pHVar5 = mipsolver->model_;
  this->model = pHVar5;
  local_40 = &this->cliquePartitionStart;
  (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&this->objectiveNonzeros,(long)pHVar5->num_col_);
  local_44 = 0;
  pHVar5 = this->model;
  if (0 < pHVar5->num_col_) {
    do {
      dVar13 = (pHVar5->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[local_44];
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        __position._M_current =
             (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->objectiveNonzeros,__position,
                     &local_44);
          pHVar5 = this->model;
        }
        else {
          *__position._M_current = local_44;
          (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      local_44 = local_44 + 1;
    } while (local_44 < pHVar5->num_col_);
  }
  local_34 = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->colToPartition,(long)pHVar5->num_col_,&local_34);
  std::vector<int,_std::allocator<int>_>::resize(local_40,1);
  piVar12 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar2 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar12 == piVar2) {
    this->numIntegral = 0;
    this->numBinary = 0;
    dVar13 = 1.0;
  }
  else {
    pHVar3 = (mipsolver->model_->integrality_).
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = piVar12;
    piVar9 = piVar2;
    do {
      while (piVar10 = piVar8, iVar6 = *piVar10, pHVar3[iVar6] == kContinuous) {
        do {
          piVar9 = piVar9 + -1;
          if (piVar9 == piVar10) goto LAB_002ce294;
        } while (pHVar3[*piVar9] == kContinuous);
        *piVar10 = *piVar9;
        *piVar9 = iVar6;
        piVar8 = piVar10 + 1;
        if (piVar9 == piVar10 + 1) {
          piVar10 = piVar10 + 1;
          goto LAB_002ce294;
        }
      }
      piVar8 = piVar10 + 1;
      piVar10 = piVar9;
    } while (piVar8 != piVar9);
LAB_002ce294:
    iVar6 = (int)((ulong)((long)piVar10 - (long)piVar12) >> 2);
    this->numIntegral = iVar6;
    if (iVar6 == 0) {
      HVar7 = 0;
    }
    else {
      uVar11 = ((long)piVar10 - (long)piVar12) * 0x40000000;
      piVar8 = piVar12;
      if (uVar11 >> 0x20 != 0) {
        pHVar5 = mipsolver->model_;
        pdVar4 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = piVar12 + ((long)uVar11 >> 0x20);
        piVar9 = piVar12;
        do {
          while( true ) {
            iVar6 = *piVar9;
            dVar13 = pdVar4[iVar6];
            piVar10 = piVar8;
            if ((((dVar13 == 0.0) && (!NAN(dVar13))) &&
                (dVar13 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[iVar6], dVar13 == 1.0)) &&
               (!NAN(dVar13))) break;
            do {
              piVar10 = piVar10 + -1;
              piVar8 = piVar9;
              if (piVar9 == piVar10) goto LAB_002ce372;
              iVar1 = *piVar10;
              dVar13 = pdVar4[iVar1];
            } while (((dVar13 != 0.0) || (NAN(dVar13))) ||
                    ((dVar13 = (pHVar5->col_upper_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1], dVar13 != 1.0 ||
                     (NAN(dVar13)))));
            *piVar9 = iVar1;
            *piVar10 = iVar6;
            piVar9 = piVar9 + 1;
            piVar8 = piVar10;
            if (piVar10 == piVar9) goto LAB_002ce372;
          }
          piVar9 = piVar9 + 1;
        } while (piVar9 != piVar8);
      }
LAB_002ce372:
      HVar7 = (HighsInt)((ulong)((long)piVar8 - (long)piVar12) >> 2);
    }
    this->numBinary = HVar7;
    std::vector<double,_std::allocator<double>_>::reserve
              (&this->objectiveVals,(long)piVar2 - (long)piVar12 >> 2);
    piVar2 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar12 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar12 != piVar2; piVar12 = piVar12 + 1) {
      __args = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + *piVar12;
      __position_00._M_current =
           (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->objectiveVals,__position_00,
                   __args);
      }
      else {
        *__position_00._M_current = *__args;
        (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
    }
    dVar13 = 0.0;
  }
  this->objIntScale = dVar13;
  return;
}

Assistant:

HighsObjectiveFunction::HighsObjectiveFunction(const HighsMipSolver& mipsolver)
    : model(mipsolver.model_) {
  objectiveNonzeros.reserve(model->num_col_);

  for (HighsInt i = 0; i < model->num_col_; ++i) {
    if (model->col_cost_[i] != 0.0) {
      objectiveNonzeros.push_back(i);
    }
  }

  colToPartition.resize(model->num_col_, -1);
  cliquePartitionStart.resize(1);

  if (objectiveNonzeros.empty()) {
    numBinary = 0;
    numIntegral = 0;
    objIntScale = 1.0;
    return;
  }

  numIntegral =
      std::partition(objectiveNonzeros.begin(), objectiveNonzeros.end(),
                     [&](HighsInt i) {
                       return mipsolver.variableType(i) !=
                              HighsVarType::kContinuous;
                     }) -
      objectiveNonzeros.begin();

  if (numIntegral == 0)
    numBinary = 0;
  else
    numBinary =
        std::partition(objectiveNonzeros.begin(),
                       objectiveNonzeros.begin() + numIntegral,
                       [&](HighsInt i) {
                         return mipsolver.model_->col_lower_[i] == 0.0 &&
                                mipsolver.model_->col_upper_[i] == 1.0;
                       }) -
        objectiveNonzeros.begin();

  objectiveVals.reserve(objectiveNonzeros.size());
  for (HighsInt i : objectiveNonzeros)
    objectiveVals.push_back(model->col_cost_[i]);

  objIntScale = 0.0;
}